

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void add_bb_insn_dead_vars(gen_ctx_t gen_ctx)

{
  int iVar1;
  bb_t_conflict local_70;
  bb_t_conflict bb;
  insn_var_iterator_t insn_var_iter;
  bitmap_t live;
  int local_38;
  int op_num;
  int scan_var;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_reg_t var;
  bb_insn_t_conflict prev_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  gen_ctx_t gen_ctx_local;
  
  insn = (MIR_insn_t)gen_ctx;
  if (gen_ctx->optimize_level == 0) {
    __assert_fail("gen_ctx->optimize_level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
  }
  insn_var_iter.op_part_num = (size_t)bitmap_create2(0x100);
  for (local_70 = DLIST_bb_t_head((DLIST_bb_t *)(*(long *)&insn[3].field_0x18 + 0x18));
      local_70 != (bb_t_conflict)0x0; local_70 = DLIST_bb_t_next(local_70)) {
    bitmap_copy((bitmap_t)insn_var_iter.op_part_num,local_70->out);
    prev_bb_insn = DLIST_bb_insn_t_tail(&local_70->bb_insns);
    while (prev_bb_insn != (bb_insn_t_conflict)0x0) {
      _early_clobbered_hard_reg1 = DLIST_bb_insn_t_prev(prev_bb_insn);
      clear_bb_insn_dead_vars((gen_ctx_t)insn,prev_bb_insn);
      bb_insn = (bb_insn_t_conflict)prev_bb_insn->insn;
      insn_var_iterator_init((insn_var_iterator_t *)&bb,(MIR_insn_t)bb_insn);
      while (iVar1 = output_insn_var_iterator_next
                               ((gen_ctx_t)insn,(insn_var_iterator_t *)&bb,
                                &early_clobbered_hard_reg2,(int *)((long)&live + 4)), iVar1 != 0) {
        local_38 = var_to_scan_var((gen_ctx_t)insn,early_clobbered_hard_reg2);
        if (-1 < local_38) {
          bitmap_clear_bit_p((bitmap_t)insn_var_iter.op_part_num,(long)local_38);
        }
      }
      if ((*(int *)(*(long *)&insn[4].field_0x18 + 4) == 0) &&
         (iVar1 = MIR_call_code_p((MIR_insn_code_t)bb_insn->gvn_val), iVar1 != 0)) {
        bitmap_and_compl((bitmap_t)insn_var_iter.op_part_num,(bitmap_t)insn_var_iter.op_part_num,
                         (bitmap_t)insn[3].insn_link.prev);
      }
      insn_var_iterator_init((insn_var_iterator_t *)&bb,(MIR_insn_t)bb_insn);
      while (iVar1 = input_insn_var_iterator_next
                               ((gen_ctx_t)insn,(insn_var_iterator_t *)&bb,
                                &early_clobbered_hard_reg2,(int *)((long)&live + 4)), iVar1 != 0) {
        local_38 = var_to_scan_var((gen_ctx_t)insn,early_clobbered_hard_reg2);
        if ((-1 < local_38) &&
           (iVar1 = bitmap_set_bit_p((bitmap_t)insn_var_iter.op_part_num,(long)local_38), iVar1 != 0
           )) {
          add_bb_insn_dead_var((gen_ctx_t)insn,prev_bb_insn,early_clobbered_hard_reg2);
        }
      }
      if (*(int *)(*(long *)&insn[4].field_0x18 + 4) == 0) {
        target_get_early_clobbered_hard_regs
                  ((MIR_insn_t)bb_insn,(MIR_reg_t *)&scan_var,(MIR_reg_t *)&op_num);
        if (scan_var != -1) {
          bitmap_clear_bit_p((bitmap_t)insn_var_iter.op_part_num,(ulong)(uint)scan_var);
        }
        if (op_num != -1) {
          bitmap_clear_bit_p((bitmap_t)insn_var_iter.op_part_num,(ulong)(uint)op_num);
        }
        iVar1 = MIR_call_code_p((MIR_insn_code_t)bb_insn->gvn_val);
        if (iVar1 != 0) {
          bitmap_ior((bitmap_t)insn_var_iter.op_part_num,(bitmap_t)insn_var_iter.op_part_num,
                     prev_bb_insn->call_hard_reg_args);
        }
      }
      prev_bb_insn = _early_clobbered_hard_reg1;
    }
  }
  bitmap_destroy((bitmap_t)insn_var_iter.op_part_num);
  return;
}

Assistant:

static void add_bb_insn_dead_vars (gen_ctx_t gen_ctx) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, prev_bb_insn;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  int scan_var, op_num;
  bitmap_t live;
  insn_var_iterator_t insn_var_iter;

  /* we need all var analysis and bb insns to keep dead var info */
  gen_assert (optimize_level > 0);
  live = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_copy (live, bb->live_out);
    for (bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = prev_bb_insn) {
      prev_bb_insn = DLIST_PREV (bb_insn_t, bb_insn);
      clear_bb_insn_dead_vars (gen_ctx, bb_insn);
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        bitmap_clear_bit_p (live, scan_var);
      }
      if (scan_vars_num == 0 && MIR_call_code_p (insn->code))
        bitmap_and_compl (live, live, call_used_hard_regs[MIR_T_UNDEF]);
      FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        if (bitmap_set_bit_p (live, scan_var)) add_bb_insn_dead_var (gen_ctx, bb_insn, var);
      }
      if (scan_vars_num != 0) continue;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg1);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg2);
      if (MIR_call_code_p (insn->code)) bitmap_ior (live, live, bb_insn->call_hard_reg_args);
    }
  }
  bitmap_destroy (live);
}